

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void insert_fully_flipped_container(roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  container_t *pcVar4;
  container_t *pcVar5;
  undefined2 in_DX;
  roaring_array_t *in_RSI;
  container_t *container_to_flip;
  container_t *flipped_container;
  uint8_t ctype_out;
  uint8_t ctype_in;
  int j;
  int i;
  undefined7 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  uint8_t *in_stack_ffffffffffffffd0;
  uint8_t *result_type;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffec;
  
  iVar1 = ra_get_index((roaring_array_t *)
                       CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
  iVar2 = ra_get_index((roaring_array_t *)
                       CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
  result_type = (uint8_t *)0x0;
  if (iVar1 < 0) {
    pcVar4 = container_range_of_ones(0,0,in_stack_ffffffffffffffd0);
    ra_insert_new_key_value_at
              ((roaring_array_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               (int32_t)((ulong)pcVar4 >> 0x20),(uint16_t)((ulong)pcVar4 >> 0x10),
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  }
  else {
    pcVar4 = ra_get_container_at_index(in_RSI,(uint16_t)iVar1,&stack0xffffffffffffffe3);
    pcVar5 = container_not((container_t *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffec,iVar1)),
                           (uint8_t)((uint)iVar2 >> 0x18),result_type);
    iVar3 = container_get_cardinality
                      ((container_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                       '\0');
    if (iVar3 == 0) {
      container_free(pcVar4,in_stack_ffffffffffffffcf);
    }
    else {
      ra_insert_new_key_value_at
                ((roaring_array_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                 (int32_t)((ulong)pcVar5 >> 0x20),(uint16_t)((ulong)pcVar5 >> 0x10),pcVar4,
                 in_stack_ffffffffffffffcf);
    }
  }
  return;
}

Assistant:

static void insert_fully_flipped_container(roaring_array_t *ans_arr,
                                           const roaring_array_t *x1_arr,
                                           uint16_t hb) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container =
            container_not(container_to_flip, ctype_in, &ctype_out);
        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(0U, 0x10000U, &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}